

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCodeSubselect(Parse *pParse,Expr *pExpr)

{
  int local_1c;
  int reg;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  local_1c = 0;
  if (pExpr->op == 'w') {
    local_1c = sqlite3CodeSubselect(pParse,pExpr,0,0);
  }
  return local_1c;
}

Assistant:

static int exprCodeSubselect(Parse *pParse, Expr *pExpr){
  int reg = 0;
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->op==TK_SELECT ){
    reg = sqlite3CodeSubselect(pParse, pExpr, 0, 0);
  }
#endif
  return reg;
}